

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O0

int set_form_fields(FORM *form,FIELD **fields)

{
  FIELD **fields_00;
  int *piVar1;
  int res;
  FIELD **old;
  FIELD **fields_local;
  FORM *form_local;
  
  if (form == (FORM *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
    form_local._4_4_ = -2;
  }
  else if ((form->status & 1) == 0) {
    fields_00 = form->field;
    Disconnect_Fields(form);
    form_local._4_4_ = Associate_Fields(form,fields);
    if (form_local._4_4_ != 0) {
      Connect_Fields(form,fields_00);
    }
    piVar1 = __errno_location();
    *piVar1 = form_local._4_4_;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = -3;
    form_local._4_4_ = -3;
  }
  return form_local._4_4_;
}

Assistant:

int set_form_fields(FORM  * form, FIELD ** fields)
{
  FIELD **old;
  int res;
  
  if ( !form )	
    RETURN(E_BAD_ARGUMENT);

  if ( form->status & _POSTED )	
    RETURN(E_POSTED);
  
  old = form->field;
  Disconnect_Fields( form );
  
  if( (res = Associate_Fields( form, fields )) != E_OK )
    Connect_Fields( form, old );
  
  RETURN(res);
}